

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

HighsStatus __thiscall HEkk::solve(HEkk *this,bool force_phase2)

{
  HighsDebugStatus HVar1;
  HighsStatus HVar2;
  HighsStatus HVar3;
  undefined8 uVar4;
  HighsStatus extraout_var;
  byte in_SIL;
  HEkk *in_RDI;
  HEkkPrimal primal_solver_1;
  HEkkDual dual_solver;
  HEkkPrimal primal_solver;
  HighsInt *simplex_strategy;
  string algorithm_name;
  HighsStatus call_status;
  HighsStatus return_status;
  bool report_initial_basis;
  bool simplex_nla_ok;
  HighsDebugStatus simplex_nla_status;
  HighsLogOptions *in_stack_ffffffffffffc5b8;
  HEkk *in_stack_ffffffffffffc5c0;
  HighsInt in_stack_ffffffffffffc5c8;
  HighsInt in_stack_ffffffffffffc5cc;
  HighsSimplexAnalysis *in_stack_ffffffffffffc5d0;
  HighsLogOptions *pHVar5;
  HighsOptions *in_stack_ffffffffffffc5d8;
  undefined4 in_stack_ffffffffffffc5e0;
  uint uVar6;
  undefined4 in_stack_ffffffffffffc5e4;
  uint uVar7;
  undefined4 in_stack_ffffffffffffc600;
  undefined4 in_stack_ffffffffffffc604;
  HighsStatus in_stack_ffffffffffffc608;
  HighsStatus HVar8;
  HighsStatus in_stack_ffffffffffffc60c;
  HighsStatus call_status_00;
  HighsLogOptions *in_stack_ffffffffffffc610;
  undefined4 in_stack_ffffffffffffc630;
  HEkk *simplex;
  HighsSimplexAnalysis *this_00;
  string local_39b0 [32];
  undefined4 local_3990;
  allocator local_3989;
  string local_3988 [20];
  HighsModelStatus in_stack_ffffffffffffc68c;
  HEkk *in_stack_ffffffffffffc728;
  HEkkDual *in_stack_ffffffffffffc730;
  undefined1 in_stack_ffffffffffffc7ff;
  HighsSimplexInfo *in_stack_ffffffffffffc800;
  HighsInt in_stack_ffffffffffffc80c;
  HighsLogOptions *in_stack_ffffffffffffc810;
  string *in_stack_ffffffffffffca90;
  HSimplexNla *in_stack_ffffffffffffca98;
  undefined1 local_32b1 [104];
  undefined1 in_stack_ffffffffffffcdb7;
  HEkkDual *in_stack_ffffffffffffcdb8;
  undefined1 in_stack_fffffffffffff1f7;
  HEkkPrimal *in_stack_fffffffffffff1f8;
  allocator local_751;
  string local_750 [1744];
  HighsInt *local_80;
  string local_78 [32];
  HighsStatus local_58;
  HighsStatus local_54;
  undefined1 local_4e;
  undefined1 local_4d;
  undefined1 local_39 [33];
  HighsDebugStatus local_18;
  byte local_11;
  HighsStatus local_4;
  
  local_11 = in_SIL & 1;
  debugInitialise((HEkk *)CONCAT44(in_stack_ffffffffffffc5e4,in_stack_ffffffffffffc5e0));
  initialiseAnalysis((HEkk *)CONCAT44(in_stack_ffffffffffffc604,in_stack_ffffffffffffc600));
  initialiseControl(in_RDI);
  if (((in_RDI->analysis_).analyse_simplex_time & 1U) != 0) {
    HighsSimplexAnalysis::simplexTimerStart
              (in_stack_ffffffffffffc5d0,in_stack_ffffffffffffc5cc,in_stack_ffffffffffffc5c8);
  }
  in_RDI->dual_simplex_cleanup_level_ = 0;
  in_RDI->dual_simplex_phase1_cleanup_level_ = 0;
  in_RDI->previous_iteration_cycling_detected = -0x7fffffff;
  initialiseForSolve(in_stack_ffffffffffffc5c0);
  simplex = (HEkk *)&in_RDI->simplex_nla_;
  this_00 = (HighsSimplexAnalysis *)local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_39 + 1),"Before HEkk::solve()",(allocator *)this_00)
  ;
  HVar1 = HSimplexNla::debugCheckData(in_stack_ffffffffffffca98,in_stack_ffffffffffffca90);
  std::__cxx11::string::~string((string *)(local_39 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_39);
  local_4d = HVar1 == kOk;
  local_18 = HVar1;
  if ((bool)local_4d) {
    local_4e = 0;
    if (in_RDI->model_status_ == kOptimal) {
      local_4 = returnFromEkkSolve(in_stack_ffffffffffffc5c0,
                                   (HighsStatus)((ulong)in_stack_ffffffffffffc5b8 >> 0x20));
    }
    else {
      local_54 = kOk;
      std::__cxx11::string::string(local_78);
      clearRayRecords(in_stack_ffffffffffffc5c0);
      (in_RDI->info_).allow_cost_shifting = true;
      (in_RDI->info_).allow_cost_perturbation = true;
      (in_RDI->info_).allow_bound_perturbation = true;
      chooseSimplexStrategyThreads
                ((HEkk *)CONCAT44(in_stack_ffffffffffffc5e4,in_stack_ffffffffffffc5e0),
                 in_stack_ffffffffffffc5d8,(HighsSimplexInfo *)in_stack_ffffffffffffc5d0);
      local_80 = &(in_RDI->info_).simplex_strategy;
      if (*local_80 == 4) {
        std::__cxx11::string::operator=(local_78,"primal");
        reportSimplexPhaseIterations
                  (in_stack_ffffffffffffc810,in_stack_ffffffffffffc80c,in_stack_ffffffffffffc800,
                   (bool)in_stack_ffffffffffffc7ff);
        highsLogUser(&(in_RDI->options_->super_HighsOptionsStruct).log_options,kInfo,
                     "Using EKK primal simplex solver\n");
        HEkkPrimal::HEkkPrimal((HEkkPrimal *)this_00,simplex);
        local_58 = HEkkPrimal::solve(in_stack_fffffffffffff1f8,(bool)in_stack_fffffffffffff1f7);
        HighsLogOptions::HighsLogOptions
                  ((HighsLogOptions *)in_stack_ffffffffffffc5c0,in_stack_ffffffffffffc5b8);
        HVar8 = (HighsStatus)((ulong)in_stack_ffffffffffffc5b8 >> 0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_750,"HEkkPrimal::solve",&local_751);
        local_54 = interpretCallStatus(in_stack_ffffffffffffc610,in_stack_ffffffffffffc60c,
                                       in_stack_ffffffffffffc608,
                                       (string *)
                                       CONCAT44(in_stack_ffffffffffffc604,in_stack_ffffffffffffc600)
                                      );
        std::__cxx11::string::~string(local_750);
        std::allocator<char>::~allocator((allocator<char> *)&local_751);
        HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x76adb1);
        HEkkPrimal::~HEkkPrimal((HEkkPrimal *)in_stack_ffffffffffffc5c0);
      }
      else {
        std::__cxx11::string::operator=(local_78,"dual");
        reportSimplexPhaseIterations
                  (in_stack_ffffffffffffc810,in_stack_ffffffffffffc80c,in_stack_ffffffffffffc800,
                   (bool)in_stack_ffffffffffffc7ff);
        if (*local_80 == 2) {
          highsLogUser(&(in_RDI->options_->super_HighsOptionsStruct).log_options,kInfo,
                       "Using EKK parallel dual simplex solver - SIP with concurrency of %d\n",
                       (ulong)(uint)(in_RDI->info_).num_concurrency);
        }
        else if (*local_80 == 3) {
          highsLogUser(&(in_RDI->options_->super_HighsOptionsStruct).log_options,kInfo,
                       "Using EKK parallel dual simplex solver - PAMI with concurrency of %d\n",
                       (ulong)(uint)(in_RDI->info_).num_concurrency);
        }
        else {
          highsLogUser(&(in_RDI->options_->super_HighsOptionsStruct).log_options,kInfo,
                       "Using EKK dual simplex solver - serial\n");
        }
        HEkkDual::HEkkDual(in_stack_ffffffffffffc730,in_stack_ffffffffffffc728);
        local_58 = HEkkDual::solve(in_stack_ffffffffffffcdb8,(bool)in_stack_ffffffffffffcdb7);
        HighsLogOptions::HighsLogOptions
                  ((HighsLogOptions *)in_stack_ffffffffffffc5c0,in_stack_ffffffffffffc5b8);
        pHVar5 = (HighsLogOptions *)local_32b1;
        HVar8 = local_58;
        call_status_00 = local_54;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_32b1 + 1),"HEkkDual::solve",(allocator *)pHVar5);
        HVar2 = interpretCallStatus(pHVar5,call_status_00,HVar8,
                                    (string *)
                                    CONCAT44(in_stack_ffffffffffffc604,in_stack_ffffffffffffc600));
        local_54 = HVar2;
        std::__cxx11::string::~string((string *)(local_32b1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_32b1);
        HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x76b037);
        if ((in_RDI->model_status_ == kUnboundedOrInfeasible) &&
           (((in_RDI->options_->super_HighsOptionsStruct).allow_unbounded_or_infeasible & 1U) == 0))
        {
          HEkkPrimal::HEkkPrimal((HEkkPrimal *)this_00,simplex);
          HVar3 = HEkkPrimal::solve(in_stack_fffffffffffff1f8,(bool)in_stack_fffffffffffff1f7);
          local_58 = HVar3;
          HighsLogOptions::HighsLogOptions
                    ((HighsLogOptions *)in_stack_ffffffffffffc5c0,in_stack_ffffffffffffc5b8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_3988,"HEkkPrimal::solve",&local_3989);
          local_54 = interpretCallStatus(pHVar5,call_status_00,HVar8,(string *)CONCAT44(HVar2,HVar3)
                                        );
          std::__cxx11::string::~string(local_3988);
          std::allocator<char>::~allocator((allocator<char> *)&local_3989);
          HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x76b156);
          HEkkPrimal::~HEkkPrimal((HEkkPrimal *)in_stack_ffffffffffffc5c0);
        }
        HVar8 = (HighsStatus)((ulong)in_stack_ffffffffffffc5b8 >> 0x20);
        HEkkDual::~HEkkDual((HEkkDual *)CONCAT44(HVar1,in_stack_ffffffffffffc630));
      }
      reportSimplexPhaseIterations
                (in_stack_ffffffffffffc810,in_stack_ffffffffffffc80c,in_stack_ffffffffffffc800,
                 (bool)in_stack_ffffffffffffc7ff);
      if (local_54 == kError) {
        local_4 = returnFromEkkSolve(in_stack_ffffffffffffc5c0,HVar8);
      }
      else {
        pHVar5 = &(in_RDI->options_->super_HighsOptionsStruct).log_options;
        uVar4 = std::__cxx11::string::c_str();
        uVar6 = (in_RDI->info_).num_primal_infeasibilities;
        uVar7 = (in_RDI->info_).num_dual_infeasibilities;
        utilModelStatusToString_abi_cxx11_(in_stack_ffffffffffffc68c);
        std::__cxx11::string::c_str();
        HVar8 = extraout_var;
        highsLogDev(pHVar5,kInfo,
                    "EKK %s simplex solver returns %d primal and %d dual infeasibilities: Status %s\n"
                    ,uVar4,(ulong)uVar6,(ulong)uVar7);
        std::__cxx11::string::~string(local_39b0);
        if (((in_RDI->analysis_).analyse_simplex_summary_data & 1U) != 0) {
          HighsSimplexAnalysis::summaryReport((HighsSimplexAnalysis *)in_stack_ffffffffffffc730);
        }
        if (((in_RDI->analysis_).analyse_factor_data & 1U) != 0) {
          HighsSimplexAnalysis::reportInvertFormData
                    ((HighsSimplexAnalysis *)in_stack_ffffffffffffc5c0);
        }
        if (((in_RDI->analysis_).analyse_factor_time & 1U) != 0) {
          HighsSimplexAnalysis::reportFactorTimer(this_00);
        }
        local_4 = returnFromEkkSolve(in_stack_ffffffffffffc5c0,HVar8);
      }
      local_3990 = 1;
      std::__cxx11::string::~string(local_78);
    }
  }
  else {
    highsLogUser(&(in_RDI->options_->super_HighsOptionsStruct).log_options,kError,
                 "Error in simplex NLA data\n");
    local_4 = returnFromEkkSolve(in_stack_ffffffffffffc5c0,
                                 (HighsStatus)((ulong)in_stack_ffffffffffffc5b8 >> 0x20));
  }
  return local_4;
}

Assistant:

HighsStatus HEkk::solve(const bool force_phase2) {
  debugInitialise();

  initialiseAnalysis();
  initialiseControl();

  if (analysis_.analyse_simplex_time)
    analysis_.simplexTimerStart(SimplexTotalClock);
  dual_simplex_cleanup_level_ = 0;
  dual_simplex_phase1_cleanup_level_ = 0;

  previous_iteration_cycling_detected = -kHighsIInf;

  initialiseForSolve();

  const HighsDebugStatus simplex_nla_status =
      simplex_nla_.debugCheckData("Before HEkk::solve()");
  const bool simplex_nla_ok = simplex_nla_status == HighsDebugStatus::kOk;
  if (!simplex_nla_ok) {
    highsLogUser(options_->log_options, HighsLogType::kError,
                 "Error in simplex NLA data\n");
    assert(simplex_nla_ok);
    return returnFromEkkSolve(HighsStatus::kError);
  }

  const bool report_initial_basis = false;
  if (report_initial_basis) debugReportInitialBasis();

  assert(status_.has_basis);
  assert(status_.has_invert);
  assert(status_.initialised_for_solve);
  if (model_status_ == HighsModelStatus::kOptimal)
    return returnFromEkkSolve(HighsStatus::kOk);

  HighsStatus return_status = HighsStatus::kOk;
  HighsStatus call_status;
  std::string algorithm_name;

  // Indicate that dual and primal rays are not known
  this->clearRayRecords();

  // Allow primal and dual perturbations in case a block on them is
  // hanging over from a previous call
  info_.allow_cost_shifting = true;
  info_.allow_cost_perturbation = true;
  info_.allow_bound_perturbation = true;

  chooseSimplexStrategyThreads(*options_, info_);
  HighsInt& simplex_strategy = info_.simplex_strategy;

  // Initial solve according to strategy
  if (simplex_strategy == kSimplexStrategyPrimal) {
    algorithm_name = "primal";
    reportSimplexPhaseIterations(options_->log_options, iteration_count_, info_,
                                 true);
    highsLogUser(options_->log_options, HighsLogType::kInfo,
                 "Using EKK primal simplex solver\n");
    HEkkPrimal primal_solver(*this);
    call_status = primal_solver.solve(force_phase2);
    assert(called_return_from_solve_);
    return_status = interpretCallStatus(options_->log_options, call_status,
                                        return_status, "HEkkPrimal::solve");
  } else {
    algorithm_name = "dual";
    reportSimplexPhaseIterations(options_->log_options, iteration_count_, info_,
                                 true);
    // Solve, depending on the particular strategy
    if (simplex_strategy == kSimplexStrategyDualTasks) {
      highsLogUser(options_->log_options, HighsLogType::kInfo,
                   "Using EKK parallel dual simplex solver - SIP with "
                   "concurrency of %d\n",
                   int(info_.num_concurrency));
    } else if (simplex_strategy == kSimplexStrategyDualMulti) {
      highsLogUser(options_->log_options, HighsLogType::kInfo,
                   "Using EKK parallel dual simplex solver - PAMI with "
                   "concurrency of %d\n",
                   int(info_.num_concurrency));
    } else {
      highsLogUser(options_->log_options, HighsLogType::kInfo,
                   "Using EKK dual simplex solver - serial\n");
    }
    HEkkDual dual_solver(*this);
    call_status = dual_solver.solve(force_phase2);
    assert(called_return_from_solve_);
    return_status = interpretCallStatus(options_->log_options, call_status,
                                        return_status, "HEkkDual::solve");

    // Dual simplex solver may set model_status to be
    // kUnboundedOrInfeasible, and Highs::run() may not allow that to
    // be returned, so use primal simplex to distinguish
    if (model_status_ == HighsModelStatus::kUnboundedOrInfeasible &&
        !options_->allow_unbounded_or_infeasible) {
      HEkkPrimal primal_solver(*this);
      call_status = primal_solver.solve();
      assert(called_return_from_solve_);
      return_status = interpretCallStatus(options_->log_options, call_status,
                                          return_status, "HEkkPrimal::solve");
    }
  }

  reportSimplexPhaseIterations(options_->log_options, iteration_count_, info_);
  if (return_status == HighsStatus::kError)
    return returnFromEkkSolve(return_status);
  highsLogDev(options_->log_options, HighsLogType::kInfo,
              "EKK %s simplex solver returns %" HIGHSINT_FORMAT
              " primal and %" HIGHSINT_FORMAT
              " dual infeasibilities: "
              "Status %s\n",
              algorithm_name.c_str(), info_.num_primal_infeasibilities,
              info_.num_dual_infeasibilities,
              utilModelStatusToString(model_status_).c_str());
  // Can model_status_ = HighsModelStatus::kNotset be returned?
  assert(model_status_ != HighsModelStatus::kNotset);

  if (analysis_.analyse_simplex_summary_data) analysis_.summaryReport();
  if (analysis_.analyse_factor_data) analysis_.reportInvertFormData();
  if (analysis_.analyse_factor_time) analysis_.reportFactorTimer();
  return returnFromEkkSolve(return_status);
}